

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::looksLikeInteger(string *string)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong local_20;
  size_t index;
  string *string_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_20 = 0;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string);
    if ((*pcVar3 == '-') ||
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string), *pcVar3 == '+')) {
      local_20 = 1;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string);
    bVar1 = isDigitCharacter(*pcVar3);
    if (bVar1) {
      do {
        uVar2 = local_20;
        local_20 = uVar2 + 1;
        uVar4 = std::__cxx11::string::length();
        if (uVar4 <= local_20) {
          return true;
        }
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string);
        bVar1 = isDigitCharacter(*pcVar3);
      } while (bVar1);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string);
      if ((((*pcVar3 == '.') ||
           (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string), *pcVar3 == 'e')) ||
          (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string), *pcVar3 == 'E')) &&
         (uVar4 = std::__cxx11::string::length(), uVar2 + 2 < uVar4)) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string);
        bVar1 = isDigitCharacter(*pcVar3);
        if (((bVar1) ||
            (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string), *pcVar3 == '-')) ||
           (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string), *pcVar3 == '+')) {
          return false;
        }
      }
      string_local._7_1_ = true;
    }
    else {
      string_local._7_1_ = false;
    }
  }
  else {
    string_local._7_1_ = false;
  }
  return string_local._7_1_;
}

Assistant:

static bool looksLikeInteger(const std::string& string)
{
    if (string.empty()) {
        // LCOV_EXCL_START
        return false;
        // LCOV_EXCL_STOP
    }
    size_t index = 0;
    if (string[0] == '-' || string[0] == '+') {
        ++index;
    }
    if (!isDigitCharacter(string[index])) {
        // at some point need to figure out how to get to this line
        return false;  // LCOV_EXCL_LINE
    }
    ++index;
    while (index < string.length()) {
        if (!isDigitCharacter(string[index])) {
            if (string[index] == '.' || string[index] == 'e' ||
                string[index] == 'E') {
                if (index + 1 < string.length()) {
                    if (isDigitCharacter(string[index + 1]) ||
                        string[index + 1] == '-' || string[index + 1] == '+') {
                        return false;
                    }
                }
            }
            return true;
        }
        ++index;
    }
    return true;
}